

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UnicodeSet::spanBackUTF8
          (UnicodeSet *this,char *s,int32_t length,USetSpanCondition spanCondition)

{
  byte bVar1;
  UBool UVar2;
  int32_t iVar3;
  uint c;
  size_t sVar4;
  UnicodeSetStringSpan strSpan;
  int local_14c;
  UnicodeSetStringSpan local_148;
  
  if (length < 1) {
    if (-1 < length) {
      return 0;
    }
    sVar4 = strlen(s);
    length = (int32_t)sVar4;
    if (length == 0) {
      return 0;
    }
  }
  else if (this->bmpSet != (BMPSet *)0x0) {
    iVar3 = BMPSet::spanBackUTF8(this->bmpSet,(uint8_t *)s,length,spanCondition);
    return iVar3;
  }
  if (this->stringSpan != (UnicodeSetStringSpan *)0x0) {
    iVar3 = UnicodeSetStringSpan::spanBackUTF8(this->stringSpan,(uint8_t *)s,length,spanCondition);
    return iVar3;
  }
  if (this->strings->count != 0) {
    UnicodeSetStringSpan::UnicodeSetStringSpan
              (&local_148,this,this->strings,0x16 - (spanCondition == USET_SPAN_NOT_CONTAINED));
    if (local_148.maxLength8 != 0) {
      iVar3 = UnicodeSetStringSpan::spanBackUTF8(&local_148,(uint8_t *)s,length,spanCondition);
      UnicodeSetStringSpan::~UnicodeSetStringSpan(&local_148);
      return iVar3;
    }
    UnicodeSetStringSpan::~UnicodeSetStringSpan(&local_148);
  }
  do {
    local_14c = length + -1;
    bVar1 = s[(long)length + -1];
    c = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      c = utf8_prevCharSafeBody_63((uint8_t *)s,0,&local_14c,(uint)bVar1,-3);
    }
    UVar2 = contains(this,c);
  } while (((uint)(spanCondition != USET_SPAN_NOT_CONTAINED) == (int)UVar2) &&
          (length = local_14c, 0 < local_14c));
  return length;
}

Assistant:

int32_t UnicodeSet::spanBackUTF8(const char *s, int32_t length, USetSpanCondition spanCondition) const {
    if(length>0 && bmpSet!=NULL) {
        const uint8_t *s0=(const uint8_t *)s;
        return bmpSet->spanBackUTF8(s0, length, spanCondition);
    }
    if(length<0) {
        length=(int32_t)uprv_strlen(s);
    }
    if(length==0) {
        return 0;
    }
    if(stringSpan!=NULL) {
        return stringSpan->spanBackUTF8((const uint8_t *)s, length, spanCondition);
    } else if(!strings->isEmpty()) {
        uint32_t which= spanCondition==USET_SPAN_NOT_CONTAINED ?
                            UnicodeSetStringSpan::BACK_UTF8_NOT_CONTAINED :
                            UnicodeSetStringSpan::BACK_UTF8_CONTAINED;
        UnicodeSetStringSpan strSpan(*this, *strings, which);
        if(strSpan.needsStringSpanUTF8()) {
            return strSpan.spanBackUTF8((const uint8_t *)s, length, spanCondition);
        }
    }

    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    UChar32 c;
    int32_t prev=length;
    do {
        U8_PREV_OR_FFFD(s, 0, length, c);
        if(spanCondition!=contains(c)) {
            break;
        }
    } while((prev=length)>0);
    return prev;
}